

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O3

void __thiscall
(anonymous_namespace)::CAPIExternalCommand::processDependencyInfoDiscoveredDependencies(llbuild::
buildsystem::BuildSystem&,llbuild::core::TaskInterface,llbuild::basic::QueueJobContext*,std::__cxx11
::string)::DepsActions::actOnInput(llvm::StringRef_(void *this,StringRef path)

{
  BuildSystemDelegate *pBVar1;
  BuildKey local_70;
  long *local_50 [2];
  long local_40 [2];
  
  llbuild::buildsystem::BuildKey::BuildKey(&local_70,'N',path);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,local_70.key.key._M_dataplus._M_p,
             local_70.key.key._M_dataplus._M_p + local_70.key.key._M_string_length);
  llbuild::core::TaskInterface::discoveredDependency
            ((TaskInterface *)((long)this + 0x10),(KeyType *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.key.key._M_dataplus._M_p != &local_70.key.key.field_2) {
    operator_delete(local_70.key.key._M_dataplus._M_p,
                    local_70.key.key.field_2._M_allocated_capacity + 1);
  }
  pBVar1 = llbuild::buildsystem::BuildSystem::getDelegate(*(BuildSystem **)((long)this + 8));
  (*pBVar1->_vptr_BuildSystemDelegate[0xf])
            (pBVar1,*(undefined8 *)((long)this + 0x20),path.Data,path.Length,0);
  return;
}

Assistant:

virtual void actOnInput(StringRef path) override {
        ti.discoveredDependency(BuildKey::makeNode(path).toData());
        system.getDelegate().commandFoundDiscoveredDependency(command, path, DiscoveredDependencyKind::Input);
      }